

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator--(base_uint<256U> *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  int i;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  while( true ) {
    bVar4 = false;
    if (local_14 < 8) {
      uVar3 = in_RDI->pn[local_14] - 1;
      in_RDI->pn[local_14] = uVar3;
      uVar2 = std::numeric_limits<unsigned_int>::max();
      bVar4 = uVar3 == uVar2;
    }
    if (!bVar4) break;
    local_14 = local_14 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator--()
    {
        // prefix operator
        int i = 0;
        while (i < WIDTH && --pn[i] == std::numeric_limits<uint32_t>::max())
            i++;
        return *this;
    }